

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O2

IterateResult __thiscall glcts::BlendEquationSeparateCase::ModeCase::iterate(ModeCase *this)

{
  GLint GVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ulong in_RAX;
  undefined4 extraout_var;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  GLint alphaEq;
  GLint rgbEq;
  long lVar5;
  
  _alphaEq = in_RAX;
  bVar2 = IsExtensionSupported((this->super_TestCase).m_context,"GL_KHR_blend_equation_advanced");
  if (bVar2) {
    iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar5 = CONCAT44(extraout_var,iVar3);
    (**(code **)(lVar5 + 0x108))(this->m_mode,0x8006);
    iVar3 = (**(code **)(lVar5 + 0x800))();
    _alphaEq = (ulong)(uint)alphaEq;
    (**(code **)(lVar5 + 0x868))(0x8009,&rgbEq);
    GVar1 = rgbEq;
    (**(code **)(lVar5 + 0x108))(0x8006,this->m_mode);
    iVar4 = (**(code **)(lVar5 + 0x800))();
    _alphaEq = _alphaEq & 0xffffffff00000000;
    (**(code **)(lVar5 + 0x868))(0x883d,&alphaEq);
    testResult = (qpTestResult)
                 (alphaEq != 0x8006 || (iVar4 != 0x500 || (GVar1 != 0x8006 || iVar3 != 0x500)));
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Pass";
    if (alphaEq != 0x8006 || (iVar4 != 0x500 || (GVar1 != 0x8006 || iVar3 != 0x500))) {
      description = "Fail";
    }
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "GL_KHR_blend_equation_advanced";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

IterateResult iterate(void)
		{
			// Check that extension is supported.
			if (!IsExtensionSupported(m_context, "GL_KHR_blend_equation_advanced"))
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "GL_KHR_blend_equation_advanced");
				return STOP;
			}

			const glw::Functions& gl = m_context.getRenderContext().getFunctions();

			// Set separate blend equations.
			// Expect error and that default value (FUNC_ADD) is not changed.

			// RGB.
			gl.blendEquationSeparate(m_mode, GL_FUNC_ADD);
			bool	   rgbOk = gl.getError() == GL_INVALID_ENUM;
			glw::GLint rgbEq = GL_NONE;
			gl.getIntegerv(GL_BLEND_EQUATION_RGB, &rgbEq);
			rgbOk = rgbOk && (rgbEq == GL_FUNC_ADD);

			// Alpha.
			gl.blendEquationSeparate(GL_FUNC_ADD, m_mode);
			bool	   alphaOk = gl.getError() == GL_INVALID_ENUM;
			glw::GLint alphaEq = GL_NONE;
			gl.getIntegerv(GL_BLEND_EQUATION_ALPHA, &alphaEq);
			alphaOk = alphaOk && (alphaEq == GL_FUNC_ADD);

			bool pass = rgbOk && alphaOk;
			m_testCtx.setTestResult(pass ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, pass ? "Pass" : "Fail");
			return STOP;
		}